

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O0

aom_codec_err_t parse_timing_info(aom_read_bit_buffer *rb)

{
  uint32_t uVar1;
  uint32_t uVar2;
  int iVar3;
  uint32_t num_ticks_per_picture_minus_1;
  uint8_t equal_picture_interval;
  uint32_t time_scale;
  uint32_t num_units_in_display_tick;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  aom_codec_err_t local_4;
  
  uVar1 = aom_rb_read_unsigned_literal
                    ((aom_read_bit_buffer *)
                     CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     in_stack_ffffffffffffffdc);
  uVar2 = aom_rb_read_unsigned_literal
                    ((aom_read_bit_buffer *)
                     CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     in_stack_ffffffffffffffdc);
  if ((uVar1 == 0) || (uVar2 == 0)) {
    local_4 = AOM_CODEC_UNSUP_BITSTREAM;
  }
  else {
    iVar3 = aom_rb_read_bit((aom_read_bit_buffer *)CONCAT44(uVar1,uVar2));
    if (((char)iVar3 == '\0') ||
       (uVar1 = aom_rb_read_uvlc((aom_read_bit_buffer *)CONCAT44(uVar1,uVar2)), uVar1 != 0xffffffff)
       ) {
      local_4 = AOM_CODEC_OK;
    }
    else {
      local_4 = AOM_CODEC_UNSUP_BITSTREAM;
    }
  }
  return local_4;
}

Assistant:

static aom_codec_err_t parse_timing_info(struct aom_read_bit_buffer *rb) {
  const uint32_t num_units_in_display_tick =
      aom_rb_read_unsigned_literal(rb, 32);
  const uint32_t time_scale = aom_rb_read_unsigned_literal(rb, 32);
  if (num_units_in_display_tick == 0 || time_scale == 0)
    return AOM_CODEC_UNSUP_BITSTREAM;
  const uint8_t equal_picture_interval = aom_rb_read_bit(rb);
  if (equal_picture_interval) {
    const uint32_t num_ticks_per_picture_minus_1 = aom_rb_read_uvlc(rb);
    if (num_ticks_per_picture_minus_1 == UINT32_MAX) {
      // num_ticks_per_picture_minus_1 cannot be (1 << 32) - 1.
      return AOM_CODEC_UNSUP_BITSTREAM;
    }
  }
  return AOM_CODEC_OK;
}